

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::resize
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,double target_density,bool force_retrain,bool keep_left,bool keep_right)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  ulong *puVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  double dVar9;
  int iVar10;
  unsigned_long *__s;
  int *piVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  size_type __n;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  longdouble lVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM6_Qb;
  undefined1 local_a8 [96];
  undefined8 uStack_48;
  ulong local_38;
  
  iVar20 = this->num_keys_;
  if (iVar20 == 0) {
    return;
  }
  iVar18 = iVar20 + 1;
  if (iVar20 + 1 <= (int)((double)iVar20 / target_density)) {
    iVar18 = (int)((double)iVar20 / target_density);
  }
  dVar33 = (double)iVar18;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar33 * 0.015625;
  auVar35 = vroundsd_avx(auVar35,auVar35,10);
  uVar16 = vcvttsd2usi_avx512f(auVar35);
  uVar14 = 0;
  __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                  ((new_allocator<unsigned_long> *)local_a8,uVar16,(void *)0x0);
  local_38 = uVar16;
  memset(__s,0,-(ulong)(uVar16 >> 0x3d != 0) | uVar16 * 8);
  __n = (size_type)iVar18;
  piVar11 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)local_a8,__n,(void *)0x0);
  piVar12 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)local_a8,__n,(void *)0x0);
  if (this->num_keys_ < 0x32 || force_retrain) {
    puVar4 = this->bitmap_;
    uVar16 = *puVar4;
    if (uVar16 == 0) {
      uVar15 = this->bitmap_size_;
      uVar14 = 1;
      uVar22 = 0xffffffff;
      uVar16 = 0;
      if (1 < (long)(int)uVar15) {
        uVar14 = 1;
        do {
          uVar16 = puVar4[uVar14];
          if (uVar16 != 0) goto LAB_0013b273;
          uVar14 = uVar14 + 1;
        } while ((long)(int)uVar15 != uVar14);
        uVar14 = (ulong)uVar15;
        uVar16 = 0;
      }
    }
    else {
LAB_0013b273:
      uVar22 = 0;
      for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        uVar22 = uVar22 + 1;
      }
      uVar22 = uVar22 | (int)uVar14 << 6;
      uVar16 = uVar16 - 1 & uVar16;
    }
    local_a8._0_8_ = &(this->super_AlexNode<int,_int>).model_;
    local_a8._8_4_ = 0;
    local_a8._16_10_ = (unkbyte10)0;
    local_a8._80_4_ = 0x7fffffff;
    local_a8._84_4_ = -0x80000000;
    uStack_48 = 0xffefffffffffffff;
    local_a8._88_8_ = 0x7fefffffffffffff;
    local_a8._32_10_ = local_a8._16_10_;
    local_a8._48_10_ = local_a8._16_10_;
    local_a8._64_10_ = local_a8._16_10_;
    if (uVar22 != 0xffffffff && (int)uVar22 < this->data_capacity_) {
      local_a8._84_4_ = -0x80000000;
      local_a8._80_4_ = 0x7fffffff;
      local_a8._8_4_ = 0;
      uVar19 = (ulong)this->bitmap_size_;
      iVar20 = 0;
      do {
        iVar10 = this->key_slots_[(int)uVar22];
        local_a8._8_4_ = local_a8._8_4_ + 1;
        lVar32 = (longdouble)iVar10;
        local_a8._16_10_ = (longdouble)local_a8._16_10_ + lVar32;
        local_a8._32_10_ = (longdouble)local_a8._32_10_ + (longdouble)iVar20;
        local_a8._48_10_ = lVar32 * lVar32 + (longdouble)local_a8._48_10_;
        local_a8._64_10_ = (longdouble)iVar20 * lVar32 + (longdouble)local_a8._64_10_;
        if (iVar10 <= (int)local_a8._80_4_) {
          local_a8._80_4_ = iVar10;
        }
        if (iVar10 < (int)local_a8._84_4_) {
          iVar10 = local_a8._84_4_;
        }
        local_a8._84_4_ = iVar10;
        if (uVar16 == 0) {
          lVar17 = (long)(int)uVar14;
          uVar21 = lVar17 + 1U;
          if ((long)(lVar17 + 1U) < (long)uVar19) {
            lVar23 = 1;
            do {
              uVar16 = puVar4[lVar17 + lVar23];
              if (uVar16 != 0) {
                uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar23);
                goto LAB_0013b3d8;
              }
              lVar23 = lVar23 + 1;
              uVar21 = uVar19;
            } while (uVar19 - lVar17 != lVar23);
          }
          uVar22 = 0xffffffff;
          uVar14 = uVar21 & 0xffffffff;
        }
        else {
LAB_0013b3d8:
          uVar22 = 0;
          for (uVar21 = uVar16; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            uVar22 = uVar22 + 1;
          }
          uVar22 = uVar22 | (int)uVar14 << 6;
          uVar16 = uVar16 - 1 & uVar16;
        }
        auVar38._0_8_ = (double)iVar20;
        auVar38._8_8_ = auVar38._0_8_;
        auVar35 = vunpcklpd_avx(unique0x10000354,auVar38);
        lVar17 = local_a8._96_8_;
        auVar43._8_8_ = lVar17;
        auVar43._0_8_ = auVar38._0_8_;
        uVar21 = vcmppd_avx512vl(auVar35,auVar43,1);
        bVar7 = (bool)((byte)(uVar21 & 3) & 1);
        local_a8._88_8_ = (ulong)bVar7 * local_a8._88_8_ | (ulong)!bVar7 * (long)auVar38._0_8_;
        uVar21 = (uVar21 & 3) >> 1;
        uStack_48 = uVar21 * lVar17 | (ulong)!SUB81(uVar21,0) * (long)auVar38._0_8_;
      } while ((uVar22 != 0xffffffff) && (iVar20 = iVar20 + 1, (int)uVar22 < this->data_capacity_));
    }
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_a8);
    if (!keep_left) {
      if (keep_right) {
        iVar20 = this->data_capacity_;
        dVar34 = (double)iVar20 / (double)this->num_keys_;
        (this->super_AlexNode<int,_int>).model_.a_ =
             dVar34 * (this->super_AlexNode<int,_int>).model_.a_;
        dVar34 = dVar34 * (this->super_AlexNode<int,_int>).model_.b_ + (double)(iVar18 - iVar20);
        goto LAB_0013b4e6;
      }
      iVar20 = this->num_keys_;
      goto LAB_0013b4f4;
    }
    uVar1 = this->data_capacity_;
    uVar2 = this->num_keys_;
    auVar3._4_4_ = uVar2;
    auVar3._0_4_ = uVar1;
    auVar3._8_8_ = 0;
    auVar35 = vcvtdq2pd_avx(auVar3);
    auVar38 = vshufpd_avx(auVar35,auVar35,1);
    dVar34 = auVar35._0_8_ / auVar38._0_8_;
  }
  else {
    if (keep_right) {
      dVar34 = (double)(iVar18 - this->data_capacity_) + (this->super_AlexNode<int,_int>).model_.b_;
LAB_0013b4e6:
      (this->super_AlexNode<int,_int>).model_.b_ = dVar34;
      goto LAB_0013b50e;
    }
    if (keep_left) goto LAB_0013b50e;
    iVar20 = this->data_capacity_;
LAB_0013b4f4:
    dVar34 = dVar33 / (double)iVar20;
  }
  dVar9 = (this->super_AlexNode<int,_int>).model_.b_;
  (this->super_AlexNode<int,_int>).model_.a_ = dVar34 * (this->super_AlexNode<int,_int>).model_.a_;
  (this->super_AlexNode<int,_int>).model_.b_ = dVar34 * dVar9;
LAB_0013b50e:
  puVar4 = this->bitmap_;
  uVar16 = *puVar4;
  uVar14 = 0;
  if (uVar16 == 0) {
    uVar15 = this->bitmap_size_;
    uVar14 = 1;
    uVar22 = 0xffffffff;
    uVar16 = 0;
    if (1 < (long)(int)uVar15) {
      uVar14 = 1;
      do {
        uVar16 = puVar4[uVar14];
        if (uVar16 != 0) goto LAB_0013b521;
        uVar14 = uVar14 + 1;
      } while ((long)(int)uVar15 != uVar14);
      uVar14 = (ulong)uVar15;
      uVar16 = 0;
    }
  }
  else {
LAB_0013b521:
    uVar22 = 0;
    for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
      uVar22 = uVar22 + 1;
    }
    uVar22 = uVar22 | (int)uVar14 << 6;
    uVar16 = uVar16 - 1 & uVar16;
  }
  uVar15 = 0xffffffff;
  if ((uVar22 != 0xffffffff) && ((int)uVar22 < this->data_capacity_)) {
    piVar5 = this->key_slots_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
    piVar6 = this->payload_slots_;
    uVar15 = 0xffffffff;
    iVar20 = this->num_keys_;
    do {
      auVar41._0_8_ = (double)piVar5[(int)uVar22];
      auVar41._8_8_ = in_XMM4_Qa;
      auVar35 = vfmadd213sd_fma(auVar41,auVar36,auVar39);
      uVar25 = (uint)auVar35._0_8_;
      uVar24 = uVar15 + 1;
      uVar8 = uVar25;
      if ((int)uVar25 < (int)uVar24) {
        uVar8 = uVar24;
      }
      if ((int)(iVar18 - uVar8) < iVar20) {
        uVar25 = iVar18 - iVar20;
        uVar19 = (ulong)uVar25;
        if ((int)uVar24 < (int)uVar25) {
          lVar17 = (long)(int)uVar15 + 1;
          do {
            piVar11[lVar17] = piVar5[(int)uVar22];
            lVar17 = lVar17 + 1;
          } while (lVar17 < (int)uVar25);
        }
        if (0 < iVar20) {
          uVar19 = (ulong)(int)uVar25;
          do {
            piVar11[uVar19] = piVar5[(int)uVar22];
            piVar12[uVar19] = piVar6[(int)uVar22];
            __s[(int)uVar19 >> 6] = __s[(int)uVar19 >> 6] | 1L << (uVar19 & 0x3f);
            if (uVar16 == 0) {
              uVar13 = (ulong)this->bitmap_size_;
              lVar17 = (long)(int)uVar14;
              uVar21 = lVar17 + 1U;
              if ((long)(lVar17 + 1U) < (long)uVar13) {
                lVar23 = 1;
                do {
                  uVar16 = puVar4[lVar17 + lVar23];
                  if (uVar16 != 0) {
                    uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar23);
                    goto LAB_0013b646;
                  }
                  lVar23 = lVar23 + 1;
                  uVar21 = uVar13;
                } while (uVar13 - lVar17 != lVar23);
              }
              uVar22 = 0xffffffff;
              uVar14 = uVar21 & 0xffffffff;
            }
            else {
LAB_0013b646:
              uVar22 = 0;
              for (uVar21 = uVar16; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                uVar22 = uVar22 + 1;
              }
              uVar22 = uVar22 | (int)uVar14 << 6;
              uVar16 = uVar16 - 1 & uVar16;
            }
            uVar19 = uVar19 + 1;
          } while ((long)uVar19 < (long)__n);
        }
        iVar10 = iVar20;
        uVar15 = (int)uVar19 - 1;
      }
      else {
        if ((int)uVar24 < (int)uVar25) {
          lVar23 = (long)(int)uVar15;
          lVar17 = (long)(int)uVar25;
          if ((long)(int)uVar25 < lVar23 + 1) {
            lVar17 = lVar23 + 1;
          }
          do {
            piVar11[lVar23 + 1] = piVar5[(int)uVar22];
            lVar23 = lVar23 + 1;
          } while ((int)lVar17 + -1 != (int)lVar23);
        }
        piVar11[(int)uVar8] = piVar5[(int)uVar22];
        piVar12[(int)uVar8] = piVar6[(int)uVar22];
        __s[(int)uVar8 >> 6] = __s[(int)uVar8 >> 6] | 1L << ((ulong)uVar8 & 0x3f);
        iVar10 = iVar20 + -1;
        uVar15 = uVar8;
      }
      if ((int)(iVar18 - uVar8) < iVar20) break;
      if (uVar16 == 0) {
        uVar21 = (ulong)this->bitmap_size_;
        lVar17 = (long)(int)uVar14;
        uVar19 = lVar17 + 1U;
        if ((long)(lVar17 + 1U) < (long)uVar21) {
          lVar23 = 1;
          do {
            uVar16 = puVar4[lVar17 + lVar23];
            if (uVar16 != 0) {
              uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar23);
              goto LAB_0013b735;
            }
            lVar23 = lVar23 + 1;
            uVar19 = uVar21;
          } while (uVar21 - lVar17 != lVar23);
        }
        uVar22 = 0xffffffff;
        uVar14 = uVar19 & 0xffffffff;
      }
      else {
LAB_0013b735:
        uVar22 = 0;
        for (uVar19 = uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          uVar22 = uVar22 + 1;
        }
        uVar22 = uVar22 | (int)uVar14 << 6;
        uVar16 = uVar16 - 1 & uVar16;
      }
      if ((uVar22 == 0xffffffff) || (iVar20 = iVar10, this->data_capacity_ <= (int)uVar22)) break;
    } while( true );
  }
  if ((int)(uVar15 + 1) < iVar18) {
    auVar26 = vpbroadcastq_avx512f();
    uVar16 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar27);
      auVar30 = vporq_avx512f(auVar30,auVar28);
      vpcmpuq_avx512f(auVar30,auVar26,2);
      vpcmpuq_avx512f(auVar31,auVar26,2);
      auVar30 = vmovdqu32_avx512f(auVar29);
      *(undefined1 (*) [64])(piVar11 + (long)(int)uVar15 + uVar16 + 1) = auVar30;
      uVar16 = uVar16 + 0x10;
    } while (((ulong)((iVar18 - uVar15) - 2) + 0x10 & 0xfffffffffffffff0) != uVar16);
  }
  operator_delete(this->key_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->payload_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->bitmap_,(long)this->bitmap_size_ << 3);
  this->data_capacity_ = iVar18;
  this->bitmap_size_ = (int)local_38;
  this->key_slots_ = piVar11;
  this->payload_slots_ = piVar12;
  this->bitmap_ = __s;
  auVar37._0_8_ = (double)(this->num_keys_ + 1);
  auVar37._8_8_ = in_XMM6_Qb;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar33;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar33 * 0.8;
  auVar35 = vmaxsd_avx(auVar37,auVar40);
  auVar35 = vminsd_avx(auVar42,auVar35);
  this->expansion_threshold_ = auVar35._0_8_;
  this->contraction_threshold_ = dVar33 * 0.6;
  return;
}

Assistant:

void resize(double target_density, bool force_retrain = false,
              bool keep_left = false, bool keep_right = false) {
    if (num_keys_ == 0) {
      return;
    }

    int new_data_capacity =
        std::max(static_cast<int>(num_keys_ / target_density), num_keys_ + 1);
    auto new_bitmap_size =
        static_cast<size_t>(std::ceil(new_data_capacity / 64.));
    auto new_bitmap = new (bitmap_allocator().allocate(new_bitmap_size))
        uint64_t[new_bitmap_size]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    T* new_key_slots =
        new (key_allocator().allocate(new_data_capacity)) T[new_data_capacity];
    P* new_payload_slots = new (payload_allocator().allocate(new_data_capacity))
        P[new_data_capacity];
#else
    V* new_data_slots = new (value_allocator().allocate(new_data_capacity))
        V[new_data_capacity];
#endif

    // Retrain model if the number of keys is sufficiently small (under 50)
    if (num_keys_ < 50 || force_retrain) {
      const_iterator_type it(this, 0);
      LinearModelBuilder<T> builder(&(this->model_));
      for (int i = 0; it.cur_idx_ < data_capacity_ && !it.is_end(); it++, i++) {
        builder.add(it.key(), i);
      }
      builder.build();
      if (keep_left) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
      } else if (keep_right) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else {
        this->model_.expand(static_cast<double>(new_data_capacity) / num_keys_);
      }
    } else {
      if (keep_right) {
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else if (!keep_left) {
        this->model_.expand(static_cast<double>(new_data_capacity) /
                            data_capacity_);
      }
    }

    int last_position = -1;
    int keys_remaining = num_keys_;
    const_iterator_type it(this, 0);
    for (; it.cur_idx_ < data_capacity_ && !it.is_end(); it++) {
      int position = this->model_.predict(it.key());
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = new_data_capacity - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = new_data_capacity - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[j] = it.key();
#else
          new_data_slots[j].first = it.key();
#endif
        }
        for (; pos < new_data_capacity; pos++, it++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[pos] = it.key();
          new_payload_slots[pos] = it.payload();
#else
          new_data_slots[pos] = *it;
#endif
          set_bit(new_bitmap, pos);
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        new_key_slots[j] = it.key();
#else
        new_data_slots[j].first = it.key();
#endif
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[position] = it.key();
      new_payload_slots[position] = it.payload();
#else
      new_data_slots[position] = *it;
#endif
      set_bit(new_bitmap, position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < new_data_capacity; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[i] = kEndSentinel_;
#else
      new_data_slots[i].first = kEndSentinel;
#endif
    }

#if ALEX_DATA_NODE_SEP_ARRAYS
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);

    data_capacity_ = new_data_capacity;
    bitmap_size_ = new_bitmap_size;
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ = new_key_slots;
    payload_slots_ = new_payload_slots;
#else
    data_slots_ = new_data_slots;
#endif
    bitmap_ = new_bitmap;

    expansion_threshold_ =
        std::min(std::max(data_capacity_ * kMaxDensity_,
                          static_cast<double>(num_keys_ + 1)),
                 static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
  }